

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_flush_flags(DisasContext_conflict2 *s)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  uintptr_t o;
  uintptr_t o_2;
  
  tcg_ctx = s->uc->tcg_ctx;
  switch(s->cc_op) {
  case CC_OP_DYNAMIC:
    gen_helper_flush_flags(tcg_ctx,tcg_ctx->cpu_env,QREG_CC_OP);
    goto LAB_0067f47a;
  case CC_OP_FLAGS:
    goto switchD_0067f18b_caseD_1;
  case CC_OP_ADDB:
  case CC_OP_ADDW:
  case CC_OP_ADDL:
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_C,QREG_CC_X);
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_sub_i32(tcg_ctx,pTVar1,QREG_CC_N,QREG_CC_V);
    gen_ext(tcg_ctx,pTVar1,pTVar1,s->cc_op - CC_OP_ADDB,1);
    tcg_gen_xor_i32(tcg_ctx,ret,QREG_CC_N,QREG_CC_V);
    tcg_gen_xor_i32(tcg_ctx,QREG_CC_V,QREG_CC_V,pTVar1);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_gen_andc_i32_m68k(tcg_ctx,QREG_CC_V,ret,QREG_CC_V);
    goto LAB_0067f316;
  case CC_OP_SUBB:
  case CC_OP_SUBW:
  case CC_OP_SUBL:
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_C,QREG_CC_X);
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_add_i32(tcg_ctx,pTVar1,QREG_CC_N,QREG_CC_V);
    gen_ext(tcg_ctx,pTVar1,pTVar1,s->cc_op - CC_OP_SUBB,1);
    tcg_gen_xor_i32(tcg_ctx,ret,QREG_CC_N,pTVar1);
    tcg_gen_xor_i32(tcg_ctx,QREG_CC_V,QREG_CC_V,pTVar1);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_gen_and_i32(tcg_ctx,QREG_CC_V,QREG_CC_V,ret);
LAB_0067f316:
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    break;
  case CC_OP_CMPB:
  case CC_OP_CMPW:
  case CC_OP_CMPL:
    tcg_gen_setcond_i32_m68k(tcg_ctx,TCG_COND_LTU,QREG_CC_C,QREG_CC_N,QREG_CC_V);
    tcg_gen_sub_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N,QREG_CC_V);
    gen_ext(tcg_ctx,QREG_CC_Z,QREG_CC_Z,s->cc_op - CC_OP_CMPB,1);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_xor_i32(tcg_ctx,pTVar1,QREG_CC_Z,QREG_CC_N);
    tcg_gen_xor_i32(tcg_ctx,QREG_CC_V,QREG_CC_V,QREG_CC_N);
    tcg_gen_and_i32(tcg_ctx,QREG_CC_V,QREG_CC_V,pTVar1);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_N,QREG_CC_Z);
    break;
  case CC_OP_LOGIC:
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_Z,QREG_CC_N);
    tcg_gen_movi_i32(tcg_ctx,QREG_CC_C,0);
    tcg_gen_movi_i32(tcg_ctx,QREG_CC_V,0);
    break;
  default:
    pTVar1 = tcg_const_i32_m68k(tcg_ctx,s->cc_op);
    gen_helper_flush_flags(tcg_ctx,tcg_ctx->cpu_env,pTVar1);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
LAB_0067f47a:
    s->cc_op_synced = 1;
  }
  s->cc_op = CC_OP_FLAGS;
switchD_0067f18b_caseD_1:
  return;
}

Assistant:

static void gen_flush_flags(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv t0, t1;

    switch (s->cc_op) {
    case CC_OP_FLAGS:
        return;

    case CC_OP_ADDB:
    case CC_OP_ADDW:
    case CC_OP_ADDL:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        /* Compute signed overflow for addition.  */
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_sub_i32(tcg_ctx, t0, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, t0, t0, s->cc_op - CC_OP_ADDB, 1);
        tcg_gen_xor_i32(tcg_ctx, t1, QREG_CC_N, QREG_CC_V);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_andc_i32(tcg_ctx, QREG_CC_V, t1, QREG_CC_V);
        tcg_temp_free(tcg_ctx, t1);
        break;

    case CC_OP_SUBB:
    case CC_OP_SUBW:
    case CC_OP_SUBL:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        /* Compute signed overflow for subtraction.  */
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_add_i32(tcg_ctx, t0, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, t0, t0, s->cc_op - CC_OP_SUBB, 1);
        tcg_gen_xor_i32(tcg_ctx, t1, QREG_CC_N, t0);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t1);
        tcg_temp_free(tcg_ctx, t1);
        break;

    case CC_OP_CMPB:
    case CC_OP_CMPW:
    case CC_OP_CMPL:
        tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, QREG_CC_C, QREG_CC_N, QREG_CC_V);
        tcg_gen_sub_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N, QREG_CC_V);
        gen_ext(tcg_ctx, QREG_CC_Z, QREG_CC_Z, s->cc_op - CC_OP_CMPB, 1);
        /* Compute signed overflow for subtraction.  */
        t0 = tcg_temp_new(tcg_ctx);
        tcg_gen_xor_i32(tcg_ctx, t0, QREG_CC_Z, QREG_CC_N);
        tcg_gen_xor_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, QREG_CC_N);
        tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_V, t0);
        tcg_temp_free(tcg_ctx, t0);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, QREG_CC_Z);
        break;

    case CC_OP_LOGIC:
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, QREG_CC_N);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
        break;

    case CC_OP_DYNAMIC:
        gen_helper_flush_flags(tcg_ctx, tcg_ctx->cpu_env, QREG_CC_OP);
        s->cc_op_synced = 1;
        break;

    default:
        t0 = tcg_const_i32(tcg_ctx, s->cc_op);
        gen_helper_flush_flags(tcg_ctx, tcg_ctx->cpu_env, t0);
        tcg_temp_free(tcg_ctx, t0);
        s->cc_op_synced = 1;
        break;
    }

    /* Note that flush_flags also assigned to env->cc_op.  */
    s->cc_op = CC_OP_FLAGS;
}